

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O3

string * __thiscall
testing::internal::
FormatForComparisonFailureMessage<pstore::chunked_sequence<(anonymous_namespace)::simple,2ul,4ul,4ul>::iterator_base<false>,pstore::chunked_sequence<(anonymous_namespace)::simple,2ul,4ul,4ul>::iterator_base<false>>
          (string *__return_storage_ptr__,internal *this,iterator_base<false> *value,
          iterator_base<false> *param_2)

{
  string *psVar1;
  stringstream ss;
  stringstream asStack_198 [16];
  ostream local_188 [112];
  ios_base local_118 [264];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  PrintBytesInObjectTo((uchar *)this,0x10,local_188);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  psVar1 = (string *)std::ios_base::~ios_base(local_118);
  return psVar1;
}

Assistant:

std::string FormatForComparisonFailureMessage(
    const T1& value, const T2& /* other_operand */) {
  return FormatForComparison<T1, T2>::Format(value);
}